

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-face.c
# Opt level: O2

void ndn_unix_face_recv(void *self,size_t param_len,void *param)

{
  uint uVar1;
  undefined4 uVar2;
  ssize_t sVar3;
  uint8_t *puVar4;
  int *piVar5;
  ndn_msg *pnVar6;
  uint8_t *puVar7;
  uint8_t *buf;
  size_t buflen;
  uint32_t local_54;
  void *pvStack_50;
  uint32_t cur_type;
  size_t local_48;
  uint8_t *local_40;
  uint local_34 [2];
  uint32_t cur_size;
  
  *(undefined8 *)((long)self + 0x98) = 0;
  sVar3 = recv(*(int *)((long)self + 0xa0),
               (void *)((long)self + (ulong)*(uint *)((long)self + 0x10a4) + 0xa4),
               0x1000 - (ulong)*(uint *)((long)self + 0x10a4),0);
  if (0 < sVar3) {
    buf = (uint8_t *)((long)self + 0xa4);
    pvStack_50 = param;
    local_48 = param_len;
    puts("Some packets recved");
    puVar7 = buf + (ulong)*(uint *)((long)self + 0x10a4) + sVar3;
    local_40 = buf;
    for (; buf < puVar7; buf = buf + local_34[0]) {
      buflen = (long)puVar7 - (long)buf;
      puVar4 = tlv_get_type_length(buf,buflen,&local_54,local_34);
      if (puVar4 == (uint8_t *)0x0) {
LAB_001108f0:
        memcpy(local_40,buf,buflen);
        uVar2 = (undefined4)buflen;
        goto LAB_0011092d;
      }
      local_34[0] = ((int)puVar4 - (int)buf) + local_34[0];
      if (puVar7 < buf + local_34[0]) goto LAB_001108f0;
      uVar1 = ndn_forwarder_receive((ndn_face_intf_t *)self,buf,(ulong)local_34[0]);
      if (uVar1 != 0) {
        printf("forwarder receive fail, error code = %d\n",(ulong)uVar1);
      }
    }
    uVar2 = 0;
LAB_0011092d:
    *(undefined4 *)((long)self + 0x10a4) = uVar2;
    param_len = local_48;
    param = pvStack_50;
LAB_0011093f:
    pnVar6 = ndn_msgqueue_post(self,ndn_unix_face_recv,param_len,param);
    *(ndn_msg **)((long)self + 0x98) = pnVar6;
    return;
  }
  if (sVar3 == -1) {
    piVar5 = __errno_location();
    if (*piVar5 == 0xb) goto LAB_0011093f;
  }
  (**(code **)((long)self + 0x10))();
  return;
}

Assistant:

static void
ndn_unix_face_recv(void *self, size_t param_len, void *param){
  ndn_unix_face_t* ptr = (ndn_unix_face_t*)self;
  ssize_t size;
  uint8_t *buf, *valptr;
  uint32_t cur_type, cur_size;

  // It works without this line but I think adding is better, following the logic.
  // So ndn_face_down won't cancel a not existing event.
  ptr->process_event = NULL;

  size = recv(ptr->sock,
              ptr->buf + ptr->offset,
              sizeof(ptr->buf) - ptr->offset,
              0);
  if(size > 0){
    printf("Some packets recved\n");
    // Some packets recved
    size += ptr->offset;
    for(buf = ptr->buf; buf < ptr->buf + size; buf += cur_size){
      valptr = tlv_get_type_length(buf, ptr->buf + size - buf, &cur_type, &cur_size);
      if(valptr == NULL){
        break;
      }
      cur_size += valptr - buf;
      if(buf + cur_size > ptr->buf + size){
        break;
      }
      int ret = ndn_forwarder_receive(&ptr->intf, buf, cur_size);
      if (ret != NDN_SUCCESS)
          printf("forwarder receive fail, error code = %d\n", ret);
    }
    if(buf < ptr->buf + size){
      // TODO: Too large packets will block the receive.
      memcpy(ptr->buf, buf, ptr->buf + size - buf);
      ptr->offset = ptr->buf + size - buf;
    }else{
      ptr->offset = 0;
    }
  }else if(size == -1 && errno == EWOULDBLOCK){
    // No more packet
  }else{
    // size == 0 means a shutdown
    ndn_face_down(&ptr->intf);
    return;
  }

  ptr->process_event = ndn_msgqueue_post(self, ndn_unix_face_recv, param_len, param);
}